

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int FindResponseDescriptorRPLIDAR
              (uchar *buf,int buflen,int *pDataResponseLength,int *pSendMode,int *pDataType,
              int *pnbBytesToRequest,uchar **pFoundResponseDescriptor,int *pnbBytesDiscarded)

{
  int local_4c;
  int local_48;
  int nbBytesToDiscard;
  int nbBytesToRequest;
  int res;
  int *pnbBytesToRequest_local;
  int *pDataType_local;
  int *pSendMode_local;
  int *pDataResponseLength_local;
  uchar *puStack_18;
  int buflen_local;
  uchar *buf_local;
  
  nbBytesToDiscard = 1;
  local_48 = -1;
  local_4c = 0;
  *pnbBytesToRequest = -1;
  *pFoundResponseDescriptor = buf;
  *pnbBytesDiscarded = 0;
  _nbBytesToRequest = pnbBytesToRequest;
  pnbBytesToRequest_local = pDataType;
  pDataType_local = pSendMode;
  pSendMode_local = pDataResponseLength;
  pDataResponseLength_local._4_4_ = buflen;
  puStack_18 = buf;
  while( true ) {
    nbBytesToDiscard =
         AnalyzeResponseDescriptorRPLIDAR
                   (*pFoundResponseDescriptor,pDataResponseLength_local._4_4_ - *pnbBytesDiscarded,
                    pSendMode_local,pDataType_local,pnbBytesToRequest_local,&local_48,&local_4c);
    if (nbBytesToDiscard == 0) {
      return 0;
    }
    if (nbBytesToDiscard == 6) break;
    *pFoundResponseDescriptor = *pFoundResponseDescriptor + local_4c;
    *pnbBytesDiscarded = local_4c + *pnbBytesDiscarded;
    if (pDataResponseLength_local._4_4_ - *pnbBytesDiscarded < 1) {
      *pFoundResponseDescriptor = (uchar *)0x0;
      return 1;
    }
  }
  *_nbBytesToRequest = local_48;
  return 6;
}

Assistant:

inline int FindResponseDescriptorRPLIDAR(unsigned char* buf, int buflen, int* pDataResponseLength, int* pSendMode, int* pDataType, 
						 int* pnbBytesToRequest, unsigned char** pFoundResponseDescriptor, int* pnbBytesDiscarded)
{
	int res = EXIT_FAILURE, nbBytesToRequest = -1, nbBytesToDiscard = 0;

	*pnbBytesToRequest = -1;
	*pFoundResponseDescriptor = buf;
	*pnbBytesDiscarded = 0;

	for (;;)
	{
		res = AnalyzeResponseDescriptorRPLIDAR(*pFoundResponseDescriptor, buflen-(*pnbBytesDiscarded), pDataResponseLength, pSendMode, pDataType, &nbBytesToRequest, &nbBytesToDiscard);
		switch (res)
		{
		case EXIT_SUCCESS:
			return EXIT_SUCCESS;
		case EXIT_OUT_OF_MEMORY:
			(*pnbBytesToRequest) = nbBytesToRequest;
			return EXIT_OUT_OF_MEMORY;
		default:
			(*pFoundResponseDescriptor) += nbBytesToDiscard;
			(*pnbBytesDiscarded) += nbBytesToDiscard;
			if (buflen-(*pnbBytesDiscarded) <= 0)
			{
				*pFoundResponseDescriptor = NULL;
				return EXIT_FAILURE;
			}
			break;
		}
	} 
}